

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O2

_Bool rtr_mgr_config_status_is_synced(rtr_mgr_group *group)

{
  ulong uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if ((group->sockets_len == uVar2) || (group->sockets[uVar2]->last_update == 0)) break;
    uVar1 = uVar2 + 1;
  } while (0xfffffffc < group->sockets[uVar2]->state - RTR_FAST_RECONNECT);
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return group->sockets_len <= uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool rtr_mgr_config_status_is_synced(const struct rtr_mgr_group *group)
{
	for (unsigned int i = 0; i < group->sockets_len; i++) {
		enum rtr_socket_state state = group->sockets[i]->state;

		if ((group->sockets[i]->last_update == 0) ||
		    ((state != RTR_ESTABLISHED) && (state != RTR_RESET) && (state != RTR_SYNC)))
			return false;
	}
	return true;
}